

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

bool __thiscall InsertProxyModelPrivate::commitToSource(InsertProxyModelPrivate *this,bool isRow)

{
  QModelIndex *this_00;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  reference this_01;
  const_iterator alast;
  iterator afirst;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t asize;
  QModelIndex *pQVar11;
  ulong i;
  QVector<int> aggregateRoles;
  QModelIndex proxyIdx;
  QModelIndex currentIdx;
  QArrayData *local_b8;
  quintptr qStack_b0;
  QAbstractItemModel *pQStack_a8;
  QModelIndex local_a0;
  ulong local_88;
  QList<QMap<int,_QVariant>_> *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this_00 = (QModelIndex *)this->q_ptr;
  lVar6 = QAbstractProxyModel::sourceModel();
  if ((lVar6 != 0) &&
     ((uVar4 = (this->m_insertDirection).i, ((byte)uVar4 & isRow) != 0 ||
      ((uVar4 & 2) != 0 && !isRow)))) {
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    local_78 = 0xffffffffffffffff;
    local_70 = 0;
    uStack_68 = 0;
    uVar4 = (**(code **)(*plVar7 + 0x80))(plVar7,&local_78);
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    local_78 = 0xffffffffffffffff;
    local_70 = 0;
    uStack_68 = 0;
    uVar5 = (**(code **)(*plVar7 + 0x78))(plVar7,&local_78);
    plVar7 = (long *)QAbstractProxyModel::sourceModel();
    if (isRow) {
      local_78 = 0xffffffffffffffff;
      local_70 = 0;
      uStack_68 = 0;
      cVar3 = (**(code **)(*plVar7 + 0xf8))(plVar7,uVar5,1);
    }
    else {
      local_78 = 0xffffffffffffffff;
      local_70 = 0;
      uStack_68 = 0;
      cVar3 = (**(code **)(*plVar7 + 0x100))(plVar7,uVar4,1);
    }
    if (cVar3 != '\0') {
      uVar8 = uVar5;
      if (isRow) {
        uVar8 = uVar4;
      }
      if ((int)uVar8 < 1) {
        return (int)uVar8 < 1;
      }
      local_80 = this->m_extraData + isRow;
      local_88 = (ulong)uVar8;
      i = 0;
      while( true ) {
        this_01 = QList<QMap<int,_QVariant>_>::operator[](local_80,i);
        pQVar1 = (this_01->d).d;
        bVar2 = false;
        if ((pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0x0) &&
           ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          plVar7 = (long *)QAbstractProxyModel::sourceModel();
          if (isRow) {
            local_b8 = (QArrayData *)0xffffffffffffffff;
            qStack_b0 = 0;
            pQStack_a8 = (QAbstractItemModel *)0x0;
            lVar6 = *plVar7;
            uVar10 = (ulong)uVar5;
            uVar9 = i & 0xffffffff;
            pQVar11 = (QModelIndex *)&local_b8;
          }
          else {
            local_a0.r = -1;
            local_a0.c = -1;
            local_a0.i = 0;
            local_a0.m = (QAbstractItemModel *)0x0;
            lVar6 = *plVar7;
            uVar10 = i & 0xffffffff;
            uVar9 = (ulong)uVar4;
            pQVar11 = &local_a0;
          }
          (**(code **)(lVar6 + 0x60))(&local_78,plVar7,uVar10,uVar9,pQVar11);
          plVar7 = (long *)QAbstractProxyModel::sourceModel();
          cVar3 = (**(code **)(*plVar7 + 0xb8))(plVar7,&local_78,this_01);
          bVar2 = true;
          if (cVar3 != '\0') {
            local_b8 = (QArrayData *)0x0;
            qStack_b0 = 0;
            pQStack_a8 = (QAbstractItemModel *)0x0;
            pQVar1 = (this_01->d).d;
            if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                           *)0x0) {
              asize = 0;
            }
            else {
              asize = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            }
            QList<int>::reserve((QList<int> *)&local_b8,asize);
            QMap<int,_QVariant>::detach(this_01);
            afirst._M_node =
                 (((this_01->d).d)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while ((pQVar1 = (this_01->d).d,
                   pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                              *)0x0 &&
                   ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))) {
              local_a0.r = afirst._M_node[1]._M_color;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_b8,(qsizetype)pQStack_a8,&local_a0.r);
              alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
              afirst._M_node = (_Base_ptr)QMap<int,_QVariant>::erase(this_01,afirst._M_node,alast);
            }
            if (isRow) {
              local_48 = 0xffffffffffffffff;
              local_40 = 0;
              uStack_38 = 0;
              (**(code **)(*(long *)this_00 + 0x60))
                        (&local_a0,this_00,uVar5 + 1,i & 0xffffffff,&local_48);
            }
            else {
              local_60 = 0xffffffffffffffff;
              local_58 = 0;
              uStack_50 = 0;
              (**(code **)(*(long *)this_00 + 0x60))
                        (&local_a0,this_00,i & 0xffffffff,uVar4 + 1,&local_60);
            }
            QAbstractItemModel::dataChanged(this_00,&local_a0,(QList *)&local_a0);
            InsertProxyModel::extraDataChanged
                      ((InsertProxyModel *)this_00,&local_a0,&local_a0,(QVector<int> *)&local_b8);
            if (local_b8 != (QArrayData *)0x0) {
              LOCK();
              (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_b8,4,8);
              }
            }
            bVar2 = false;
          }
        }
        if (bVar2) break;
        i = i + 1;
        if (i == local_88) {
          return local_88 <= i;
        }
      }
    }
  }
  return false;
}

Assistant:

bool InsertProxyModelPrivate::commitToSource(const bool isRow)
{
    Q_Q(InsertProxyModel);
    if (!q->sourceModel())
        return false;
    const bool canInsCol = m_insertDirection & InsertProxyModel::InsertColumn;
    const bool canInsRow = m_insertDirection & InsertProxyModel::InsertRow;
    if (!((isRow && canInsRow) || (!isRow && canInsCol)))
        return false;
    const int sourceCols = q->sourceModel()->columnCount();
    const int sourceRows = q->sourceModel()->rowCount();
    if (!(isRow ? q->sourceModel()->insertRow(sourceRows) : q->sourceModel()->insertColumn(sourceCols)))
        return false;
    const int loopEnd = isRow ? sourceCols : sourceRows;
    for (int i = 0; i < loopEnd; ++i) {
        RolesContainer &allRoles = m_extraData[isRow][i];
        if (allRoles.isEmpty())
            continue;
        const QModelIndex currentIdx = isRow ? q->sourceModel()->index(sourceRows, i) : q->sourceModel()->index(i, sourceCols);
        Q_ASSERT(m_separateEditDisplay || (allRoles.contains(Qt::DisplayRole) == allRoles.contains(Qt::EditRole)));
        Q_ASSERT(m_separateEditDisplay || (allRoles.value(Qt::DisplayRole) == allRoles.value(Qt::EditRole)));
        if (!q->sourceModel()->setItemData(currentIdx, convertFromContainer<QMap<int, QVariant>>(allRoles)))
            return false;
        QVector<int> aggregateRoles;
        aggregateRoles.reserve(allRoles.size());
        for (auto j = allRoles.begin(); !allRoles.isEmpty(); j = allRoles.erase(j))
            aggregateRoles << j.key();
        const QModelIndex proxyIdx = isRow ? q->index(sourceRows + 1, i) : q->index(i, sourceCols + 1);
        Q_EMIT q->dataChanged(proxyIdx, proxyIdx, aggregateRoles);
        Q_EMIT q->extraDataChanged(proxyIdx, proxyIdx, aggregateRoles);
    }
    return true;
}